

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

istream * operator>>(istream *stream,PicHeader *header)

{
  int iVar1;
  istream *in_RDI;
  int version;
  PicHeader *in_stack_00000038;
  istream *in_stack_00000040;
  PicHeader *in_stack_00000058;
  istream *in_stack_00000060;
  
  iVar1 = detectSwitch((istream *)header);
  if (iVar1 < 0) {
    readPic<PicHeaderPS3>(in_stack_00000040,in_stack_00000038);
  }
  else {
    readPic<PicHeaderSwitch>(in_stack_00000060,in_stack_00000058);
  }
  return in_RDI;
}

Assistant:

std::istream& operator>>(std::istream& stream, PicHeader& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readPic<PicHeaderPS3>(stream, header);
	} else { // Switch
		readPic<PicHeaderSwitch>(stream, header);
	}
	return stream;
}